

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moremagic.c
# Opt level: O0

void spell_remove_taint(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  int iVar2;
  CHAR_DATA *in_RCX;
  int in_ESI;
  undefined4 in_R8D;
  __type_conflict2 _Var3;
  int chance;
  OBJ_DATA *obj;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  OBJ_DATA *arg2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  arg2 = in_RCX->on;
  _Var3 = std::pow<int,int>(0,0x657f44);
  if (((ulong)arg2 & (long)_Var3) == 0) {
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  }
  else {
    iVar1 = get_skill(in_stack_000000d0,in_stack_000000cc);
    iVar1 = (in_ESI - *(short *)&in_RCX->short_descr) + iVar1 / 2;
    if (0x3b < *(short *)&in_RCX->short_descr) {
      iVar1 = iVar1 + -0x3c;
    }
    iVar2 = number_percent();
    if (iVar2 < iVar1) {
      act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),arg2,0);
      _Var3 = std::pow<int,int>(0,0x657ff6);
      in_RCX->on = (OBJ_DATA *)(((long)_Var3 ^ 0xffffffffffffffffU) & (ulong)in_RCX->on);
    }
    else {
      act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),arg2,0);
    }
  }
  return;
}

Assistant:

void spell_remove_taint(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = (OBJ_DATA *)vo;
	int chance;

	if (!IS_SET(obj->extra_flags, ITEM_EVIL))
	{
		send_to_char("It is not tainted by evil.\n\r", ch);
		return;
	}

	chance = get_skill(ch, sn) / 2;
	chance += level - obj->level;

	if (obj->level >= MAX_LEVEL)
		chance -= MAX_LEVEL;

	if (number_percent() < chance)
	{
		act("The sickly red aura of $p fades away.", ch, obj, nullptr, TO_ALL);
		REMOVE_BIT(obj->extra_flags, ITEM_EVIL);
	}
	else
	{
		act("$p shivers softly, but the sickly red aura remains.", ch, obj, nullptr, TO_ALL);
	}
}